

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_law_expansion.cc
# Opt level: O2

void __thiscall
sptk::MuLawExpansion::MuLawExpansion
          (MuLawExpansion *this,double abs_max_value,double compression_factor)

{
  this->_vptr_MuLawExpansion = (_func_int **)&PTR__MuLawExpansion_0010fcd0;
  this->abs_max_value_ = abs_max_value;
  this->compression_factor_ = compression_factor;
  this->constant_ = abs_max_value / compression_factor;
  this->is_valid_ = (bool)(-(0.0 < abs_max_value) & -(0.0 < compression_factor) & 1);
  return;
}

Assistant:

MuLawExpansion::MuLawExpansion(double abs_max_value, double compression_factor)
    : abs_max_value_(abs_max_value),
      compression_factor_(compression_factor),
      constant_(abs_max_value_ / compression_factor_),
      is_valid_(true) {
  if (abs_max_value_ <= 0.0 || compression_factor_ <= 0.0) {
    is_valid_ = false;
    return;
  }
}